

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void(std::error_code_const&,unsigned_long)>::
callback<void(*)(std::error_code_const&,unsigned_long)>
          (callback<void_(const_std::error_code_&,_unsigned_long)> *this,
          _func_void_error_code_ptr_unsigned_long *func)

{
  callable<void_(const_std::error_code_&,_unsigned_long)> *p;
  callable_impl<void,_void_(*)(const_std::error_code_&,_unsigned_long)> *in_RDI;
  _func_void_error_code_ptr_unsigned_long *in_stack_ffffffffffffffc8;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
  *in_stack_ffffffffffffffe0;
  
  p = (callable<void_(const_std::error_code_&,_unsigned_long)> *)operator_new(0x18);
  callback<void_(const_std::error_code_&,_unsigned_long)>::
  callable_impl<void,_void_(*)(const_std::error_code_&,_unsigned_long)>::callable_impl
            (in_RDI,in_stack_ffffffffffffffc8);
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::intrusive_ptr
            (in_stack_ffffffffffffffe0,p,SUB81((ulong)in_RDI >> 0x38,0));
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}